

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int countNamelessRecords(int m,int firstcode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 local_1c;
  int last;
  int codexm;
  int first;
  int firstcode_local;
  int m_local;
  
  iVar1 = firstNamelessRecord(m,firstcode);
  iVar2 = coDex(m);
  local_1c = m;
  while( true ) {
    iVar3 = coDex(local_1c);
    if (iVar3 != iVar2) break;
    local_1c = local_1c + 1;
  }
  return local_1c - iVar1;
}

Assistant:

static int countNamelessRecords(const int m, const int firstcode) {
    const int first = firstNamelessRecord(m, firstcode);
    const int codexm = coDex(m);
    int last = m;
    ASSERT((0 <= m) && (m <= MAPCODE_BOUNDARY_MAX));
    ASSERT((0 <= firstcode) && (firstcode <= MAPCODE_BOUNDARY_MAX));
    while (coDex(last) == codexm) {
        last++;
    }
    ASSERT((0 <= last) && (last <= MAPCODE_BOUNDARY_MAX));
    ASSERT(last >= first);
    return (last - first);
}